

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_16U,_4U>::Bucket::Insert
          (Bucket *this,Data<4U> *item,uint32_t seed_s,uint32_t seed_incast,bool *is_empty)

{
  Data<4U> *this_00;
  int iVar1;
  Data<4U> DVar2;
  bool bVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  Bucket *this_01;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  
  uVar5 = Data<4U>::Hash(item,seed_s);
  uVar6 = Data<4U>::Hash(item,seed_incast);
  *is_empty = false;
  iVar10 = 0x7fffffff;
  uVar8 = 0xffffffffffffffff;
  uVar9 = 0;
  this_01 = this;
  while( true ) {
    if (uVar9 == 8) {
      uVar9 = (ulong)uVar6 & 0xf;
      sVar4 = this->incast[uVar9];
      iVar1 = COUNT[uVar5 & 1];
      if (iVar10 <= sVar4 * iVar1) {
        uVar8 = uVar8 & 0xffffffff;
        if (this->counters[uVar8] < 0) {
          this_00 = this->items + uVar8;
          uVar5 = Data<4U>::Hash(this_00,seed_s);
          DVar2.str = this_00[8].str[0];
          iVar7 = COUNT[uVar5 & 1];
          uVar5 = Data<4U>::Hash(this_00,seed_incast);
          this->incast[uVar5 & 0xf] = this->incast[uVar5 & 0xf] - DVar2.str._0_2_ * (short)iVar7;
        }
        *(undefined4 *)this->items[uVar8].str = *(undefined4 *)item->str;
        this->counters[uVar8] = iVar10 + 1;
        sVar4 = this->incast[uVar9];
      }
      this->incast[uVar9] = sVar4 + (short)iVar1;
      return;
    }
    if (this_01->counters[0] == 0) break;
    bVar3 = Data<4U>::operator==(this_01->items,item);
    iVar1 = this_01->counters[0];
    if (bVar3) {
      if (-1 < iVar1) {
        this_01->counters[0] = iVar1 + 1;
        this->incast[(ulong)uVar6 & 0xf] =
             this->incast[(ulong)uVar6 & 0xf] + (short)COUNT[uVar5 & 1];
        return;
      }
      this_01->counters[0] = iVar1 + -1;
      return;
    }
    iVar7 = -iVar1;
    if (0 < iVar1) {
      iVar7 = iVar1;
    }
    if (iVar7 < iVar10) {
      uVar8 = uVar9;
    }
    uVar8 = uVar8 & 0xffffffff;
    if (iVar7 < iVar10) {
      iVar10 = iVar7;
    }
    uVar9 = uVar9 + 1;
    this_01 = (Bucket *)(this_01->items + 1);
  }
  *(undefined4 *)this_01->items[0].str = *(undefined4 *)item->str;
  this_01->counters[0] = -1;
  *is_empty = true;
  return;
}

Assistant:

void Insert(const Data<DATA_LEN>& item, uint32_t seed_s, uint32_t seed_incast, bool& is_empty) {
			uint32_t choice = item.Hash(seed_s) & 1;
			uint32_t whichcast = item.Hash(seed_incast) % counter_num;
			count_type min_num = INT_MAX;
			uint32_t min_pos = -1;
			is_empty = false;
			for (uint32_t i = 0; i < slot_num; ++i) {
				if (counters[i] == 0) {
					// The error free item's counter is negative, which is a trick to
					// be differentiated from items which are not error free.
					items[i] = item;
					counters[i] = -1;
					is_empty = true;
					return;
				}
				else if (items[i] == item) {
					if (counters[i] < 0)
						counters[i]--;
					else {
						counters[i]++;
						incast[whichcast] += COUNT[choice];
					}
					return;
				}

				count_type counter_val = std::abs(counters[i]);
				if (counter_val < min_num) {
					min_num = counter_val;
					min_pos = i;
				}
			}

			if (incast[whichcast] * COUNT[choice] >= int(min_num * factor)) {
				if (counters[min_pos] < 0) {
					uint32_t min_choice = items[min_pos].Hash(seed_s) & 1;
					incast[items[min_pos].Hash(seed_incast) % counter_num] -=
						COUNT[min_choice] * counters[min_pos];
				}
				items[min_pos] = item;
				counters[min_pos] = min_num + 1;
			}
			incast[whichcast] += COUNT[choice];
		}